

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O3

void __thiscall
luna::GC::AdjustThreshold
          (GC *this,uint alived_count,GenInfo *gen,uint min_threshold,uint max_threshold)

{
  uint uVar1;
  
  if (alived_count == 0) {
    uVar1 = gen->threshold_count_;
  }
  else {
    uVar1 = gen->threshold_count_;
    if (uVar1 < alived_count * 2) {
      do {
        uVar1 = uVar1 * 2;
      } while (uVar1 < alived_count * 2);
      gen->threshold_count_ = uVar1;
    }
    if (alived_count << 2 <= uVar1) {
      do {
        uVar1 = uVar1 >> 1;
      } while (alived_count << 2 <= uVar1);
      gen->threshold_count_ = uVar1;
    }
  }
  if ((uVar1 < min_threshold) || (min_threshold = max_threshold, max_threshold < uVar1)) {
    gen->threshold_count_ = min_threshold;
  }
  return;
}

Assistant:

void GC::AdjustThreshold(unsigned int alived_count, GenInfo &gen,
                             unsigned int min_threshold,
                             unsigned int max_threshold)
    {
        if (alived_count != 0)
        {
            while (gen.threshold_count_ < 2 * alived_count)
                gen.threshold_count_ *= 2;
            while (gen.threshold_count_ >= 4 * alived_count)
                gen.threshold_count_ /= 2;
        }

        if (gen.threshold_count_ < min_threshold)
            gen.threshold_count_ = min_threshold;
        else if (gen.threshold_count_ > max_threshold)
            gen.threshold_count_ = max_threshold;
    }